

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

round_direction
fmt::v8::detail::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  ulong in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  bool local_23;
  bool local_22;
  bool local_21;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  round_direction local_4;
  
  local_21 = in_RSI < in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  ignore_unused<bool,char[1]>(&local_21,(char (*) [1])0x1c6bb0);
  local_22 = local_20 < local_10;
  ignore_unused<bool,char[1]>(&local_22,(char (*) [1])0x1c6bb0);
  local_23 = local_20 < local_10 - local_20;
  ignore_unused<bool,char[1]>(&local_23,(char (*) [1])0x1c6bb0);
  if ((local_10 - local_18 < local_18) || (local_10 + local_18 * -2 < local_20 * 2)) {
    if ((local_18 < local_20) || (local_18 - local_20 < local_10 - (local_18 - local_20))) {
      local_4 = unknown;
    }
    else {
      local_4 = up;
    }
  }
  else {
    local_4 = down;
  }
  return local_4;
}

Assistant:

inline round_direction get_round_direction(uint64_t divisor, uint64_t remainder,
                                           uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return round_direction::down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return round_direction::up;
  }
  return round_direction::unknown;
}